

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_sparse_bit_array.cpp
# Opt level: O1

void __thiscall crnlib::sparse_bit_array::resize(sparse_bit_array *this,uint size)

{
  uint uVar1;
  uint32 **ppuVar2;
  uint uVar3;
  uint32 **ppuVar4;
  ulong uVar5;
  sparse_bit_array temp;
  sparse_bit_array local_28;
  
  uVar3 = size + 0x1ff >> 9;
  uVar1 = this->m_num_groups;
  if (uVar3 != uVar1) {
    if (size + 0x1ff < 0x200) {
      clear(this);
      return;
    }
    ppuVar2 = this->m_ppGroups;
    this->m_ppGroups = (uint32 **)0x0;
    this->m_num_groups = uVar3;
    local_28.m_num_groups = uVar1;
    local_28.m_ppGroups = ppuVar2;
    ppuVar4 = (uint32 **)crnlib_calloc((ulong)uVar3,8,(size_t *)0x0);
    this->m_ppGroups = ppuVar4;
    if (ppuVar4 == (uint32 **)0x0) {
      crnlib_assert("m_ppGroups",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_sparse_bit_array.cpp"
                    ,0x15d);
    }
    uVar3 = this->m_num_groups;
    if (uVar1 < this->m_num_groups) {
      uVar3 = uVar1;
    }
    if (uVar3 != 0) {
      uVar5 = 0;
      do {
        if (ppuVar2[uVar5] != (uint32 *)0x0) {
          this->m_ppGroups[uVar5] = ppuVar2[uVar5];
          ppuVar2[uVar5] = (uint32 *)0x0;
        }
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
    }
    clear(&local_28);
  }
  return;
}

Assistant:

void sparse_bit_array::resize(uint size)
    {
        uint num_groups = (size + cBitsPerGroup - 1) >> cBitsPerGroupShift;
        if (num_groups == m_num_groups)
        {
            return;
        }

        if (!num_groups)
        {
            clear();
            return;
        }

        sparse_bit_array temp;
        temp.swap(*this);

        m_num_groups = num_groups;
        m_ppGroups = (uint32**)crnlib_calloc(m_num_groups, sizeof(uint32*));
        CRNLIB_VERIFY(m_ppGroups);

        uint n = math::minimum(temp.m_num_groups, m_num_groups);
        for (uint i = 0; i < n; i++)
        {
            uint32* p = temp.m_ppGroups[i];
            if (p)
            {
                m_ppGroups[i] = temp.m_ppGroups[i];
                temp.m_ppGroups[i] = nullptr;
            }
        }
    }